

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O0

QWidget * __thiscall
QFusionStyle::standardPixmap
          (QFusionStyle *this,StandardPixmap standardPixmap,QStyleOption *opt,QWidget *widget)

{
  bool bVar1;
  QStyleOption *in_RCX;
  StandardPixmap in_EDX;
  QCommonStyle *in_RSI;
  QWidget *in_RDI;
  QWidget *in_R8;
  long in_FS_OFFSET;
  qreal qVar2;
  QIcon icon;
  QWidget *widget_00;
  QFusionStyle *in_stack_ffffffffffffffd0;
  undefined1 local_28 [24];
  QIcon local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  widget_00 = in_RDI;
  iconFromTheme(in_stack_ffffffffffffffd0,(StandardPixmap)((ulong)in_RDI >> 0x20));
  QIcon::availableSizes((Mode)local_28,(State)&local_10);
  bVar1 = QList<QSize>::isEmpty((QList<QSize> *)0x4f7d3e);
  QList<QSize>::~QList((QList<QSize> *)0x4f7d4e);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    QCommonStyle::standardPixmap(in_RSI,in_EDX,in_RCX,in_R8);
  }
  else {
    QSize::QSize((QSize *)widget_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    qVar2 = QStyleHelper::getDpr(widget_00);
    QIcon::pixmap((QSize *)in_RDI,qVar2,(Mode)&local_10,(State)&stack0xffffffffffffffd0);
  }
  QIcon::~QIcon(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return widget_00;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QFusionStyle::standardPixmap(StandardPixmap standardPixmap, const QStyleOption *opt,
                                     const QWidget *widget) const
{
    const auto icon = iconFromTheme(standardPixmap);
    if (!icon.availableSizes().isEmpty())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));
    return QCommonStyle::standardPixmap(standardPixmap, opt, widget);
}